

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O1

void __thiscall
ot::commissioner::CommissionerImpl::CommandReenroll
          (CommissionerImpl *this,ErrorHandler *aHandler,string *aDstAddr)

{
  undefined8 *puVar1;
  char *pcVar2;
  int iVar3;
  char *pcVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  char *pcVar5;
  bool bVar6;
  format_args args;
  format_args args_00;
  Error error;
  writer write;
  ErrorCode local_148;
  undefined1 *local_140;
  long local_138;
  undefined1 local_130 [16];
  string local_120;
  ErrorCode local_100;
  undefined1 *local_f8 [2];
  undefined1 local_e8 [16];
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  _Any_data local_a8;
  code *local_98;
  undefined1 local_88 [8];
  _Alloc_hider local_80;
  char local_70 [16];
  writer local_60 [6];
  
  local_140 = local_130;
  local_148 = kNone;
  local_138 = 0;
  local_130[0] = 0;
  iVar3 = (*(this->super_Commissioner)._vptr_Commissioner[9])();
  if ((char)iVar3 == '\0') {
    local_d8._0_8_ = local_d8._0_8_ & 0xffffffff00000000;
    local_d8.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "the commissioner is not active";
    local_d8.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x1e;
    local_d8.context_.super_basic_format_parse_context<char>._16_8_ = 0;
    local_d8.parse_funcs_[0] = (parse_func)0x0;
    pcVar5 = "the commissioner is not active";
    local_d8.context_.types_ = local_d8.types_;
    do {
      pcVar4 = pcVar5 + 1;
      if (*pcVar5 == '}') {
        if ((pcVar4 == "") || (*pcVar4 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar4 = pcVar5 + 2;
      }
      else if (*pcVar5 == '{') {
        pcVar4 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar5,"",&local_d8);
      }
      pcVar5 = pcVar4;
    } while (pcVar4 != "");
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_d8;
    ::fmt::v10::vformat_abi_cxx11_(&local_120,(v10 *)0x24ee20,(string_view)ZEXT816(0x1e),args);
    local_100 = kInvalidState;
    local_f8[0] = local_e8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_f8,local_120._M_dataplus._M_p,
               local_120._M_dataplus._M_p + local_120._M_string_length);
    local_148 = local_100;
    std::__cxx11::string::operator=((string *)&local_140,(string *)local_f8);
    if (local_f8[0] != local_e8) {
LAB_001c3cf4:
      operator_delete(local_f8[0]);
    }
  }
  else {
    iVar3 = (*(this->super_Commissioner)._vptr_Commissioner[10])(this);
    if ((char)iVar3 != '\0') {
      std::function<void_(ot::commissioner::Error)>::function
                ((function<void_(ot::commissioner::Error)> *)&local_a8,aHandler);
      puVar1 = &local_d8.context_.super_basic_format_parse_context<char>.format_str_.size_;
      local_d8._0_8_ = puVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/c/re","");
      SendProxyMessage(this,(ErrorHandler *)&local_a8,aDstAddr,(string *)&local_d8);
      if ((undefined8 *)local_d8._0_8_ != puVar1) {
        operator_delete((void *)local_d8._0_8_);
      }
      if (local_98 != (code *)0x0) {
        (*local_98)(&local_a8,&local_a8,__destroy_functor);
      }
      goto LAB_001c3d0c;
    }
    local_d8._0_8_ = (ulong)(uint)local_d8._4_4_ << 0x20;
    pcVar5 = "en-enroll a device is not in CCM Mode";
    local_d8.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "en-enroll a device is not in CCM Mode";
    local_d8.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x25;
    local_d8.context_.super_basic_format_parse_context<char>._16_8_ = 0;
    local_d8.parse_funcs_[0] = (parse_func)0x0;
    local_d8.context_.types_ = local_d8.types_;
    local_60[0].handler_ = &local_d8;
    do {
      if (pcVar5 == "") break;
      pcVar4 = pcVar5;
      if (*pcVar5 == '{') {
LAB_001c3e09:
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(local_60,pcVar5,pcVar4);
        pcVar5 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar4,"",&local_d8);
        bVar6 = true;
      }
      else {
        pcVar4 = pcVar5 + 1;
        bVar6 = pcVar4 != "";
        if (bVar6) {
          if (*pcVar4 != '{') {
            pcVar2 = pcVar5 + 2;
            do {
              pcVar4 = pcVar2;
              bVar6 = pcVar4 != "";
              if (pcVar4 == "") goto LAB_001c3e05;
              pcVar2 = pcVar4 + 1;
            } while (*pcVar4 != '{');
          }
          bVar6 = true;
        }
LAB_001c3e05:
        if (bVar6) goto LAB_001c3e09;
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(local_60,pcVar5,"");
        bVar6 = false;
      }
    } while (bVar6);
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)&local_d8;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_120,(v10 *)"en-enroll a device is not in CCM Mode",(string_view)ZEXT816(0x25),
               args_00);
    local_100 = kInvalidState;
    local_f8[0] = local_e8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_f8,local_120._M_dataplus._M_p,
               local_120._M_dataplus._M_p + local_120._M_string_length);
    local_148 = local_100;
    std::__cxx11::string::operator=((string *)&local_140,(string *)local_f8);
    if (local_f8[0] != local_e8) goto LAB_001c3cf4;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p);
  }
LAB_001c3d0c:
  if (local_148 != kNone) {
    local_88._0_4_ = local_148;
    local_80._M_p = local_70;
    std::__cxx11::string::_M_construct<char*>((string *)&local_80,local_140,local_140 + local_138);
    if ((aHandler->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*aHandler->_M_invoker)((_Any_data *)aHandler,(Error *)local_88);
    if (local_80._M_p != local_70) {
      operator_delete(local_80._M_p);
    }
  }
  if (local_140 != local_130) {
    operator_delete(local_140);
  }
  return;
}

Assistant:

void CommissionerImpl::CommandReenroll(ErrorHandler aHandler, const std::string &aDstAddr)
{
    Error error;

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));
    VerifyOrExit(IsCcmMode(), error = ERROR_INVALID_STATE("en-enroll a device is not in CCM Mode"));
    SendProxyMessage(aHandler, aDstAddr, uri::kMgmtReenroll);

exit:
    if (error != ERROR_NONE)
    {
        aHandler(error);
    }
}